

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Controller.cpp
# Opt level: O2

bool __thiscall Controller::landPerson(Controller *this,Person *p,Container *currentContainer)

{
  Boat *this_00;
  bool bVar1;
  ostream *poVar2;
  Container *to;
  string sStack_38;
  
  this_00 = this->boat;
  if (this_00 != (Boat *)currentContainer) {
    poVar2 = std::operator<<((ostream *)&std::cout,"La personne ");
    Person::getName_abi_cxx11_(&sStack_38,p);
    poVar2 = std::operator<<(poVar2,(string *)&sStack_38);
    poVar2 = std::operator<<(poVar2," n\'est pas sur le bateau");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&sStack_38);
    return false;
  }
  to = &Boat::getBank(this_00)->super_Container;
  bVar1 = tryMovePerson(this,&this_00->super_Container,to,p);
  return bVar1;
}

Assistant:

bool Controller::landPerson(Person* p, Container* currentContainer) {
    // Checks if the person is on the boat
    if (currentContainer != boat) {
        cout << "La personne " << p->getName() <<
        " n'est pas sur le bateau" << endl;
        return false;
    }

    // Tries to make the move
    return tryMovePerson(boat, boat->getBank(), p);
}